

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O2

int ConnectNMEADevice(NMEADEVICE *pNMEADevice,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  
  memset(pNMEADevice->szCfgFilePath,0,0x100);
  sprintf(pNMEADevice->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(line,0,0x100);
    memset(pNMEADevice->szDevPath + 5,0,0xfb);
    builtin_strncpy(pNMEADevice->szDevPath,"COM1",5);
    pNMEADevice->BaudRate = 0x12c0;
    pNMEADevice->timeout = 1000;
    pNMEADevice->threadperiod = 100;
    pNMEADevice->bSaveRawData = 1;
    pNMEADevice->bEnableGPGGA = 1;
    pNMEADevice->bEnableGPRMC = 0;
    pNMEADevice->bEnableGPGLL = 0;
    pNMEADevice->bEnableGPVTG = 0;
    pNMEADevice->bEnableHCHDG = 0;
    pNMEADevice->bEnableIIMWV = 0;
    pNMEADevice->bEnableWIMWV = 0;
    pNMEADevice->bEnableWIMWD = 0;
    pNMEADevice->bEnableWIMDA = 0;
    pNMEADevice->bEnableAIVDM = 0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%255s",pNMEADevice->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableGPGGA);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableGPRMC);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableGPGLL);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableGPVTG);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableHCHDG);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableIIMWV);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableWIMWV);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableWIMWD);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableWIMDA);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pNMEADevice->bEnableAIVDM);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0014599f;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0014599f:
  if (pNMEADevice->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pNMEADevice->threadperiod = 100;
  }
  memset(&pNMEADevice->LastNMEAData,0,0x3d8);
  iVar1 = OpenRS232Port(&pNMEADevice->RS232Port,pNMEADevice->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pNMEADevice->RS232Port,pNMEADevice->BaudRate,'\0',0,'\b','\0',
                                pNMEADevice->timeout);
    if (iVar1 == 0) {
      puts("NMEADevice connected.");
      return 0;
    }
    puts("Unable to connect to a NMEADevice.");
    CloseRS232Port(&pNMEADevice->RS232Port);
  }
  else {
    puts("Unable to connect to a NMEADevice.");
  }
  return 1;
}

Assistant:

inline int ConnectNMEADevice(NMEADEVICE* pNMEADevice, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pNMEADevice->szCfgFilePath, 0, sizeof(pNMEADevice->szCfgFilePath));
	sprintf(pNMEADevice->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pNMEADevice->szDevPath, 0, sizeof(pNMEADevice->szDevPath));
		sprintf(pNMEADevice->szDevPath, "COM1");
		pNMEADevice->BaudRate = 4800;
		pNMEADevice->timeout = 1000;
		pNMEADevice->threadperiod = 100;
		pNMEADevice->bSaveRawData = 1;
		pNMEADevice->bEnableGPGGA = 1;
		pNMEADevice->bEnableGPRMC = 0;
		pNMEADevice->bEnableGPGLL = 0;
		pNMEADevice->bEnableGPVTG = 0;
		pNMEADevice->bEnableHCHDG = 0;
		pNMEADevice->bEnableIIMWV = 0;
		pNMEADevice->bEnableWIMWV = 0;
		pNMEADevice->bEnableWIMWD = 0;
		pNMEADevice->bEnableWIMDA = 0;
		pNMEADevice->bEnableAIVDM = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pNMEADevice->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPGGA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPRMC) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPGLL) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPVTG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableHCHDG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableIIMWV) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableWIMWV) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableWIMWD) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableWIMDA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableAIVDM) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pNMEADevice->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pNMEADevice->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pNMEADevice->pfSaveFile = NULL;

	memset(&pNMEADevice->LastNMEAData, 0, sizeof(NMEADATA));

	if (OpenRS232Port(&pNMEADevice->RS232Port, pNMEADevice->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NMEADevice.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pNMEADevice->RS232Port, pNMEADevice->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pNMEADevice->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NMEADevice.\n");
		CloseRS232Port(&pNMEADevice->RS232Port);
		return EXIT_FAILURE;
	}

	printf("NMEADevice connected.\n");

	return EXIT_SUCCESS;
}